

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void relive::LogManager::registerIsActive
               (string *className,int level,atomic<bool> *isInit,bool *isActive)

{
  bool bVar1;
  LogManager *__m;
  LogPoints *this;
  pointer ppVar2;
  iterator local_f0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_e8;
  iterator local_e0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_d8;
  const_iterator i;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_relive::LogManager::LogPoint>
  local_c8;
  undefined1 local_98 [8];
  LogPoint point;
  string name;
  lock_guard<std::mutex> lock;
  string local_50;
  LogManager *local_30;
  LogManager *logManager;
  bool *isActive_local;
  atomic<bool> *isInit_local;
  string *psStack_10;
  int level_local;
  string *className_local;
  
  logManager = (LogManager *)isActive;
  isActive_local = (bool *)isInit;
  isInit_local._4_4_ = level;
  psStack_10 = className;
  std::__cxx11::string::string((string *)&local_50);
  __m = instance(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = __m;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)((long)&name.field_2 + 8),&__m->_mutex);
  bVar1 = std::atomic<bool>::load((atomic<bool> *)isActive_local,memory_order_relaxed);
  if (!bVar1) {
    detemplatedClassName((string *)&point._isActive,psStack_10);
    std::atomic<bool>::store((atomic<bool> *)isActive_local,true,memory_order_release);
    local_98._0_4_ = isInit_local._4_4_;
    point._0_8_ = logManager;
    this = &local_30->_logPoints;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_relive::LogManager::LogPoint>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_relive::LogManager::LogPoint_&,_true>
              (&local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&point._isActive
               ,(LogPoint *)local_98);
    i._M_node = (_Base_ptr)
                std::
                multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_relive::LogManager::LogPoint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_relive::LogManager::LogPoint>_>_>
                ::insert(this,&local_c8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_relive::LogManager::LogPoint>
    ::~pair(&local_c8);
    local_e0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(&local_30->_logLevels,(key_type *)&point._isActive);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::_Rb_tree_const_iterator(&local_d8,&local_e0);
    local_f0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(&local_30->_logLevels);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::_Rb_tree_const_iterator(&local_e8,&local_f0);
    bVar1 = std::operator!=(&local_d8,&local_e8);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->(&local_d8);
      (logManager->_mutex).super___mutex_base._M_mutex.__size[0] =
           isInit_local._4_4_ <= ppVar2->second;
    }
    else {
      (logManager->_mutex).super___mutex_base._M_mutex.__size[0] =
           isInit_local._4_4_ <= local_30->_defaultLevel;
    }
    std::__cxx11::string::~string((string *)&point._isActive);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)((long)&name.field_2 + 8));
  return;
}

Assistant:

void LogManager::registerIsActive(const std::string& className, int level, std::atomic<bool>& isInit, volatile bool& isActive)
{
    LogManager* logManager = instance();
    std::lock_guard<std::mutex> lock(logManager->_mutex);
    if (!isInit.load(std::memory_order_relaxed)) {
        std::string name = detemplatedClassName(className);
        isInit.store(true, std::memory_order_release);
        LogPoint point;
        point._level = level;
        point._isActive = &isActive;
        logManager->_logPoints.insert(LogPoints::value_type(name, point));
        LogLevels::const_iterator i = logManager->_logLevels.find(name);
        if(i != logManager->_logLevels.end())
        {
            isActive = i->second >= level;
        }
        else
        {
            isActive = logManager->_defaultLevel >= level;
        }
    }
}